

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseIf(Parser *this,bool isensure)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  Position *pos_00;
  unique_ptr *puVar4;
  byte in_DL;
  undefined7 in_register_00000031;
  Parser *this_00;
  undefined1 local_b0 [22];
  undefined2 local_9a;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  IfCase ifcase;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> local_70;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> elseBody;
  IfCase startifcase;
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  cases;
  undefined1 local_38 [7];
  bool err;
  Position pos;
  bool isensure_local;
  Parser *this_local;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  pos.endIndex._7_1_ = in_DL & 1;
  pTVar3 = Lexer::getCurrentToken(this_00->lexer);
  pos_00 = Token::getPosition(pTVar3);
  Position::Position((Position *)local_38,pos_00);
  bVar1 = false;
  std::
  vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::vector((vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
            *)&startifcase.
               super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
               .
               super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
          );
  parseIfStart((Parser *)&elseBody,isensure);
  puVar4 = (unique_ptr *)
           std::
           get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                     ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                       *)&elseBody);
  bVar2 = std::unique_ptr::operator_cast_to_bool(puVar4);
  if (bVar2) {
    puVar4 = (unique_ptr *)
             std::
             get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                       ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                         *)&elseBody);
    bVar2 = std::unique_ptr::operator_cast_to_bool(puVar4);
    if (bVar2) {
      std::
      vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
      ::push_back((vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                   *)&startifcase.
                      super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                      .
                      super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                  ,(value_type *)&elseBody);
      goto LAB_001377fa;
    }
  }
  bVar1 = true;
LAB_001377fa:
  std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>::
  unique_ptr<std::default_delete<pfederc::BodyExpr>,void>
            ((unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>> *)&local_70);
  do {
    bVar2 = expect(this_00,TOK_KW_ELSE);
    if (!bVar2) {
LAB_001378db:
      bVar2 = expect(this_00,TOK_STMT);
      if (!bVar2) {
        local_9a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
        local_b0._16_4_ = 0xc;
        pTVar3 = Lexer::getCurrentToken(this_00->lexer);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_98,(SyntaxErrorCode *)&local_9a,(Position *)(local_b0 + 0x10));
        generateError((Parser *)local_90,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this_00);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_90);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_98);
      }
      if (bVar1) {
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<std::default_delete<pfederc::Expr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (nullptr_t)0x0);
      }
      else {
        std::
        make_unique<pfederc::IfExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>,std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>,bool&>
                  ((Lexer *)local_b0,(Position *)this_00->lexer,
                   (vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                    *)local_38,
                   (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                   &startifcase.
                    super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                    .
                    super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                   ,(bool *)&local_70);
        std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
        unique_ptr<pfederc::IfExpr,std::default_delete<pfederc::IfExpr>,void>
                  ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                   (unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_> *)local_b0);
        std::unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::IfExpr,_std::default_delete<pfederc::IfExpr>_> *)local_b0);
      }
      local_b0._12_4_ = 1;
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                (&local_70);
      std::
      tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
      ::~tuple((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                *)&elseBody);
      std::
      vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
      ::~vector((vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                 *)&startifcase.
                    super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                    .
                    super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
               );
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
    }
    pTVar3 = Lexer::getCurrentToken(this_00->lexer);
    bVar2 = Token::operator==(pTVar3,TOK_EOL);
    if (bVar2) {
      Lexer::next(this_00->lexer);
      parseFunctionBody((Parser *)
                        &ifcase.
                         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                         .
                         super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                       );
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator=
                (&local_70,
                 (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                 &ifcase.
                  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  .
                  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                );
      std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
                 &ifcase.
                  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                  .
                  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                );
      goto LAB_001378db;
    }
    parseIfStart((Parser *)local_88,isensure);
    puVar4 = (unique_ptr *)
             std::
             get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                       ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                         *)local_88);
    bVar2 = std::unique_ptr::operator_cast_to_bool(puVar4);
    if (bVar2) {
      puVar4 = (unique_ptr *)
               std::
               get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::BodyExpr,std::default_delete<pfederc::BodyExpr>>>
                         ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                           *)local_88);
      bVar2 = std::unique_ptr::operator_cast_to_bool(puVar4);
      if (bVar2) {
        std::
        vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
        ::push_back((vector<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                     *)&startifcase.
                        super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
                        .
                        super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
                    ,(value_type *)local_88);
      }
    }
    std::
    tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
    ::~tuple((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
              *)local_88);
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseIf(bool isensure) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;

  std::vector<IfCase> cases;
  IfCase startifcase = parseIfStart(isensure);
  if (std::get<0>(startifcase) && std::get<1>(startifcase))
    cases.push_back(std::move(startifcase));
  else
    err = true;

  std::unique_ptr<BodyExpr> elseBody;
  while (expect(TokenType::TOK_KW_ELSE)) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
      elseBody = parseFunctionBody();
      break;
    }

    IfCase ifcase = parseIfStart(isensure);
    if (std::get<0>(ifcase) && std::get<1>(ifcase))
      cases.push_back(std::move(ifcase));
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
  }

  if (err)
    return nullptr;

  return std::make_unique<IfExpr>(lexer, pos,
    std::move(cases), std::move(elseBody), isensure);
}